

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ResolveExprListNames(NameContext *pNC,ExprList *pList)

{
  Expr *pExpr;
  uint uVar1;
  ExprList_item *pEVar2;
  int iVar3;
  Parse *pParse;
  uint uVar4;
  long lVar5;
  Walker w;
  
  if (pList == (ExprList *)0x0) {
    return 0;
  }
  pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  uVar4 = pNC->ncFlags & 0x8009010;
  uVar1 = pNC->ncFlags & 0xf7ff6fef;
  pNC->ncFlags = uVar1;
  pEVar2 = pList->a;
  lVar5 = 0;
  w.pParse = pParse;
  w.u.pNC = pNC;
  do {
    if (pList->nExpr <= lVar5) {
      pNC->ncFlags = uVar1 | uVar4;
      return 0;
    }
    pExpr = pEVar2->pExpr;
    if (pExpr != (Expr *)0x0) {
      iVar3 = pParse->nHeight + pExpr->nHeight;
      pParse->nHeight = iVar3;
      iVar3 = sqlite3ExprCheckHeight(pParse,iVar3);
      if (iVar3 != 0) {
        return 2;
      }
      walkExpr(&w,pExpr);
      (w.pParse)->nHeight = (w.pParse)->nHeight - pExpr->nHeight;
      uVar1 = pNC->ncFlags;
      if ((uVar1 & 0x8009010) != 0) {
        pExpr->flags = pExpr->flags | uVar1 & 0x8010;
        uVar4 = uVar4 | uVar1 & 0x8009010;
        uVar1 = uVar1 & 0xf7ff6fef;
        pNC->ncFlags = uVar1;
      }
      pParse = w.pParse;
      if (0 < (w.pParse)->nErr) {
        return 2;
      }
    }
    lVar5 = lVar5 + 1;
    pEVar2 = pEVar2 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveExprListNames(
  NameContext *pNC,       /* Namespace to resolve expressions in. */
  ExprList *pList         /* The expression list to be analyzed. */
){
  int i;
  int savedHasAgg = 0;
  Walker w;
  if( pList==0 ) return WRC_Continue;
  w.pParse = pNC->pParse;
  w.xExprCallback = resolveExprStep;
  w.xSelectCallback = resolveSelectStep;
  w.xSelectCallback2 = 0;
  w.u.pNC = pNC;
  savedHasAgg = pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
  for(i=0; i<pList->nExpr; i++){
    Expr *pExpr = pList->a[i].pExpr;
    if( pExpr==0 ) continue;
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight += pExpr->nHeight;
    if( sqlite3ExprCheckHeight(w.pParse, w.pParse->nHeight) ){
      return WRC_Abort;
    }
#endif
    sqlite3WalkExpr(&w, pExpr);
#if SQLITE_MAX_EXPR_DEPTH>0
    w.pParse->nHeight -= pExpr->nHeight;
#endif
    assert( EP_Agg==NC_HasAgg );
    assert( EP_Win==NC_HasWin );
    testcase( pNC->ncFlags & NC_HasAgg );
    testcase( pNC->ncFlags & NC_HasWin );
    if( pNC->ncFlags & (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg) ){
      ExprSetProperty(pExpr, pNC->ncFlags & (NC_HasAgg|NC_HasWin) );
      savedHasAgg |= pNC->ncFlags &
                          (NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
      pNC->ncFlags &= ~(NC_HasAgg|NC_MinMaxAgg|NC_HasWin|NC_OrderAgg);
    }
    if( w.pParse->nErr>0 ) return WRC_Abort;
  }
  pNC->ncFlags |= savedHasAgg;
  return WRC_Continue;
}